

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int __thiscall CVmUTF8Source::readc(CVmUTF8Source *this,void *buf0,size_t len)

{
  wchar_t wVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  byte *p;
  
  uVar3 = this->charlen - this->charidx;
  if (len <= uVar3) {
    uVar3 = len;
  }
  pcVar2 = this->str;
  p = (byte *)(pcVar2 + this->byteidx);
  if (uVar3 != 0) {
    sVar4 = 0;
    do {
      wVar1 = utf8_ptr::s_getch((char *)p);
      if (L'ÿ' < wVar1) {
        err_throw(0x7e7);
      }
      *(char *)((long)buf0 + sVar4) = (char)wVar1;
      sVar4 = sVar4 + 1;
      p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
      this->charidx = this->charidx + 1;
    } while (uVar3 != sVar4);
    pcVar2 = this->str;
  }
  this->byteidx = (long)p - (long)pcVar2;
  return (int)uVar3;
}

Assistant:

virtual int readc(void *buf0, size_t len)
    {
        /* get the output buffer pointer as a character pointer */
        char *buf = (char *)buf0;
        
        /* 
         *   limit the length to the remaining number of characters from the
         *   current position 
         */
        size_t rem = charlen - charidx;
        if (len > rem)
            len = rem;

        /* do the copy */
        utf8_ptr p((char *)str + byteidx);
        for (size_t i = 0 ; i < len ; ++i, p.inc(), ++charidx)
        {
            /* get this character */
            wchar_t ch = p.getch();

            /* if it's outside of the 0..255 range, it's an error */
            if (ch > 255)
                err_throw(VMERR_NUM_OVERFLOW);

            /* store it */
            *buf++ = (char)ch;
        }

        /* calculate the new byte index */
        byteidx = (size_t)(p.getptr() - str);

        /* return the length we copied */
        return len;
    }